

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SparseNode::SerializeWithCachedSizes
          (SparseNode *this,CodedOutputStream *output)

{
  double value;
  
  if (this->index_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(1,this->index_,output);
  }
  value = this->value_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(2,value,output);
  return;
}

Assistant:

void SparseNode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SparseNode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 index = 1;
  if (this->index() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->index(), output);
  }

  // double value = 2;
  if (this->value() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->value(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SparseNode)
}